

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void sect_SetLoadSection(char *name,SectionType type,uint32_t org,SectionSpec *attribs,
                        SectionModifier mod)

{
  bool bVar1;
  Section *pSVar2;
  uint32_t uVar3;
  char *fmt;
  
  bVar1 = checkcodesection();
  if (!bVar1) {
    return;
  }
  if (currentLoadSection == (Section *)0x0) {
    if (type == SECTTYPE_INVALID) {
      __assert_fail("type != SECTTYPE_INVALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                    ,0x65,"bool sect_HasData(enum SectionType)");
    }
    if ((type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX) {
      fmt = "`LOAD` blocks cannot create a ROM section\n";
    }
    else {
      if (mod != SECTION_FRAGMENT) {
        pSVar2 = getSection(name,type,org,attribs,mod);
        currentLoadScope = sym_GetCurrentSymbolScope();
        changeSection();
        uVar3 = 0;
        if (mod != SECTION_UNION) {
          uVar3 = pSVar2->size;
        }
        loadOffset = curOffset - uVar3;
        curOffset = uVar3;
        currentLoadSection = pSVar2;
        return;
      }
      fmt = "`LOAD FRAGMENT` is not allowed\n";
    }
  }
  else {
    fmt = "`LOAD` blocks cannot be nested\n";
  }
  error(fmt);
  return;
}

Assistant:

void sect_SetLoadSection(char const *name, enum SectionType type, uint32_t org,
			 struct SectionSpec const *attribs, enum SectionModifier mod)
{
	// Important info: currently, UNION and LOAD cannot interact, since UNION is prohibited in
	// "code" sections, whereas LOAD is restricted to them.
	// Therefore, any interactions are NOT TESTED, so lift either of those restrictions at
	// your own peril! ^^

	if (!checkcodesection())
		return;

	if (currentLoadSection) {
		error("`LOAD` blocks cannot be nested\n");
		return;
	}

	if (sect_HasData(type)) {
		error("`LOAD` blocks cannot create a ROM section\n");
		return;
	}

	if (mod == SECTION_FRAGMENT) {
		error("`LOAD FRAGMENT` is not allowed\n");
		return;
	}

	struct Section *sect = getSection(name, type, org, attribs, mod);

	currentLoadScope = sym_GetCurrentSymbolScope();
	changeSection();
	loadOffset = curOffset - (mod == SECTION_UNION ? 0 : sect->size);
	curOffset -= loadOffset;
	currentLoadSection = sect;
}